

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O0

batch<float,_xsimd::avx> *
xsimd::kernel::asin<xsimd::avx>(batch<float,_xsimd::avx> *self,requires_arch<generic> param_2)

{
  batch<float,_xsimd::avx> *pbVar1;
  batch_type z1;
  batch_type z;
  batch_bool<float,_xsimd::avx> x_larger_05;
  batch_type sign;
  batch_type x;
  undefined1 auVar2 [24];
  undefined1 auVar3 [24];
  undefined1 in_stack_fffffffffffffd20 [32];
  undefined1 auVar4 [16];
  undefined1 in_stack_fffffffffffffd40 [32];
  undefined1 auVar5 [24];
  batch<float,_xsimd::avx> *in_stack_fffffffffffffd60;
  undefined8 local_280;
  
  auVar2 = in_stack_fffffffffffffd20._0_24_;
  auVar5 = in_stack_fffffffffffffd40._8_24_;
  abs<float,xsimd::avx>(in_stack_fffffffffffffd20._16_8_);
  bitofsign<float,xsimd::avx>(auVar2._16_8_);
  batch<float,_xsimd::avx>::batch(in_stack_fffffffffffffd60,auVar5._20_4_);
  operator>(auVar2._16_8_,auVar2._8_8_);
  batch<float,_xsimd::avx>::batch(in_stack_fffffffffffffd60,auVar5._20_4_);
  auVar4 = auVar5._0_16_;
  auVar3 = (undefined1  [24])0x0;
  batch<float,_xsimd::avx>::batch(in_stack_fffffffffffffd60,auVar5._20_4_);
  xsimd::operator-(auVar4._8_8_,auVar4._0_8_);
  xsimd::operator*(auVar4._8_8_,auVar4._0_8_);
  xsimd::operator*(auVar4._8_8_,auVar4._0_8_);
  select<float,xsimd::avx>(auVar2._16_8_,auVar2._8_8_,auVar2._0_8_);
  sqrt<float,xsimd::avx>(auVar2._16_8_);
  select<float,xsimd::avx>(auVar2._16_8_,auVar2._8_8_,auVar2._0_8_);
  detail::
  horner<xsimd::batch<float,xsimd::avx>,1042983652ul,1033470198ul,1027227335ul,1019615203ul,1026339666ul>
            (local_280);
  xsimd::operator*(auVar4._8_8_,auVar4._0_8_);
  fma<float,xsimd::avx>(auVar2._16_8_,auVar2._8_8_,auVar2._0_8_);
  constants::pio2<xsimd::batch<float,xsimd::avx>>();
  auVar4 = auVar3._8_16_;
  xsimd::operator+(auVar3._16_8_,auVar3._8_8_);
  xsimd::operator-(auVar4._8_8_,auVar4._0_8_);
  select<float,xsimd::avx>(auVar3._16_8_,auVar3._8_8_,auVar3._0_8_);
  pbVar1 = operator^(auVar4._8_8_,auVar4._0_8_);
  return pbVar1;
}

Assistant:

inline batch<float, A> asin(batch<float, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<float, A>;
            batch_type x = abs(self);
            batch_type sign = bitofsign(self);
            auto x_larger_05 = x > batch_type(0.5);
            batch_type z = select(x_larger_05, batch_type(0.5) * (batch_type(1.) - x), x * x);
            x = select(x_larger_05, sqrt(z), x);
            batch_type z1 = detail::horner<batch_type,
                                           0x3e2aaae4,
                                           0x3d9980f6,
                                           0x3d3a3ec7,
                                           0x3cc617e3,
                                           0x3d2cb352>(z);
            z1 = fma(z1, z * x, x);
            z = select(x_larger_05, constants::pio2<batch_type>() - (z1 + z1), z1);
            return z ^ sign;
        }